

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugAranges.cpp
# Opt level: O3

uint32_t __thiscall llvm::DWARFDebugAranges::findAddress(DWARFDebugAranges *this,uint64_t Address)

{
  pointer pRVar1;
  ulong uVar2;
  uint32_t uVar3;
  difference_type __d;
  ulong uVar4;
  pointer pRVar5;
  
  pRVar5 = (this->Aranges).
           super__Vector_base<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar1 = (this->Aranges).
           super__Vector_base<llvm::DWARFDebugAranges::Range,_std::allocator<llvm::DWARFDebugAranges::Range>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = (long)pRVar1 - (long)pRVar5 >> 4;
  while (uVar2 = uVar4, 0 < (long)uVar2) {
    uVar4 = uVar2 >> 1;
    if ((-(ulong)((ulong)pRVar5[uVar4].Length == 0) |
        pRVar5[uVar4].LowPC + (ulong)pRVar5[uVar4].Length) <= Address) {
      pRVar5 = pRVar5 + uVar4 + 1;
      uVar4 = ~uVar4 + uVar2;
    }
  }
  uVar3 = 0xffffffff;
  if ((pRVar5 != pRVar1) && (pRVar5->LowPC <= Address)) {
    uVar3 = pRVar5->CUOffset;
  }
  return uVar3;
}

Assistant:

uint32_t DWARFDebugAranges::findAddress(uint64_t Address) const {
  RangeCollIterator It =
      partition_point(Aranges, [=](Range R) { return R.HighPC() <= Address; });
  if (It != Aranges.end() && It->LowPC <= Address)
    return It->CUOffset;
  return -1U;
}